

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

err_t bign96Start(void *state,bign_params *params)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  word wVar4;
  void *stack;
  err_t eVar5;
  qr_o *r;
  
  sVar2 = gfpCreate_keep(0x18);
  sVar3 = ecpCreateJ_keep(3);
  r = (qr_o *)(sVar3 + (long)state);
  stack = (void *)((long)&(r->hdr).keep + sVar2);
  bVar1 = gfpCreate(r,params->p,0x18,stack);
  eVar5 = 0x1f6;
  if (bVar1 != 0) {
    sVar2 = wwBitSize(r->mod,3);
    if (sVar2 == 0xc0) {
      wVar4 = wwGetBits(r->mod,0,2);
      if (wVar4 == 3) {
        bVar1 = ecpCreateJ((ec_o *)state,r,params->a,params->b,stack);
        if (bVar1 != 0) {
          bVar1 = ecCreateGroup((ec_o *)state,(octet *)0x0,params->yG,params->q,0x18,1,stack);
          if (bVar1 != 0) {
            sVar2 = wwBitSize(*(word **)((long)state + 0x38),3);
            if (sVar2 == params->l * 2) {
              bVar1 = zzIsEven(*(word **)((long)state + 0x38),3);
              if (bVar1 == 0) {
                eVar5 = 0;
                objAppend(state,r,0);
              }
            }
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t bign96Start(void* state, const bign_params* params)
{
	// размерности
	size_t n;
	size_t f_keep;
	size_t ec_keep;
	// состояние
	qr_o* f;		/* поле */
	ec_o* ec;		/* кривая */
	void* stack;	/* вложенный стек */
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	ASSERT(params->l == 96);
	ASSERT(memIsValid(state, bign96Start_keep(0)));
	// определить размерности
	n = W_OF_B(192);
	f_keep = gfpCreate_keep(24);
	ec_keep = ecpCreateJ_keep(n);
	// создать поле и выполнить минимальные проверки p
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, 24, stack) ||
		wwBitSize(f->mod, n) != 192 ||
		wwGetBits(f->mod, 0, 2) != 3)
		return ERR_BAD_PARAMS;
	// создать кривую и группу, выполнить минимальную проверку order
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, 0, params->yG, params->q, 24, 1, stack) ||
		wwBitSize(ec->order, n) != params->l * 2 ||
		zzIsEven(ec->order, n))
		return ERR_BAD_PARAMS;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	return ERR_OK;
}